

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O3

Var Js::JavascriptDate::EntryGetDate(RecyclableObject *function,CallInfo callInfo,...)

{
  Type *pTVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptDate *pJVar8;
  ScriptContext *pSVar9;
  Type tv;
  int in_stack_00000010;
  undefined1 local_40 [8];
  CallInfo callInfo_local;
  Var result;
  ArgumentReader args;
  
  pSVar9 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = (undefined1  [8])callInfo;
  ThreadContext::ProbeStack(pSVar9->threadContext,0xc00,pSVar9,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x12d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb440f;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pSVar9 = (ScriptContext *)local_40;
  result = (Var)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,(CallInfo *)pSVar9);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    pSVar9 = (ScriptContext *)0x130;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x130,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bb440f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((ulong)result & 0xffffff) != 0) {
    pSVar9 = (ScriptContext *)0x0;
    pvVar7 = Arguments::operator[]((Arguments *)&result,0);
    bVar3 = VarIs<Js::JavascriptDate>(pvVar7);
    if (bVar3) {
      pvVar7 = Arguments::operator[]((Arguments *)&result,0);
      pJVar8 = VarTo<Js::JavascriptDate>(pvVar7);
      uVar5 = (pJVar8->m_date).m_grfval;
      if ((uVar5 & 8) == 0) {
        bVar3 = NumberUtilities::IsNan((pJVar8->m_date).m_tvUtc);
        if (bVar3) {
          return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).nan.ptr;
        }
        uVar5 = (pJVar8->m_date).m_grfval | 8;
        (pJVar8->m_date).m_grfval = uVar5;
      }
      if ((uVar5 & 2) == 0) {
        if ((uVar5 & 1) == 0) {
          tv = DateImplementation::GetTvLcl<Js::ScriptContext>
                         ((pJVar8->m_date).m_tvUtc,scriptContext,&(pJVar8->m_date).m_tzd);
          (pJVar8->m_date).m_tvLcl = tv;
          pTVar1 = &(pJVar8->m_date).m_grfval;
          *(byte *)pTVar1 = (byte)*pTVar1 | 1;
        }
        else {
          tv = (pJVar8->m_date).m_tvLcl;
        }
        DateUtilities::GetYmdFromTv(tv,&(pJVar8->m_date).m_ymdLcl);
        pTVar1 = &(pJVar8->m_date).m_grfval;
        *(byte *)pTVar1 = (byte)*pTVar1 | 2;
      }
      return (Var)((ulong)((pJVar8->m_date).m_ymdLcl.mday + 1) | 0x1000000000000);
    }
  }
  callInfo_local = (CallInfo)0x0;
  BVar4 = TryInvokeRemotely(EntryGetDate,pSVar9,(Arguments *)&result,(Var *)&callInfo_local);
  if (BVar4 != 0) {
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.getDate");
}

Assistant:

Var JavascriptDate::EntryGetDate(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryGetDate, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.getDate"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

        if (!date->m_date.IsNaN())
        {
            return date->m_date.GetDate(scriptContext);
        }
        return scriptContext->GetLibrary()->GetNaN();
    }